

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void forget_single_object(int obj_id)

{
  int oindx;
  ulong uVar1;
  
  uVar1 = (ulong)(uint)obj_id;
  do {
    oindx = (int)uVar1;
    objects[oindx].field_0x10 = objects[oindx].field_0x10 & 0xfe;
    objects[oindx].field_0x10 = objects[oindx].field_0x10 & 0xf7;
    if (objects[oindx].oc_uname != (char *)0x0) {
      free(objects[oindx].oc_uname);
      objects[oindx].oc_uname = (char *)0x0;
    }
    undiscover_object(oindx);
  } while (((oindx - 0x5fU < 0xb) &&
           (uVar1 = (ulong)(oindx - 0xb), (objects[uVar1].field_0x10 & 1) != 0)) ||
          ((oindx - 0x54U < 0xb &&
           (uVar1 = (ulong)(oindx + 0xbU), (objects[oindx + 0xbU].field_0x10 & 1) != 0))));
  return;
}

Assistant:

static void forget_single_object(int obj_id)
{
	objects[obj_id].oc_name_known = 0;
	objects[obj_id].oc_pre_discovered = 0;	/* a discovery when relearned */
	if (objects[obj_id].oc_uname) {
	    free(objects[obj_id].oc_uname);
	    objects[obj_id].oc_uname = 0;
	}
	undiscover_object(obj_id);	/* after clearing oc_name_known */

	if (Is_dragon_scales(obj_id) &&
	    objects[Dragon_scales_to_mail(obj_id)].oc_name_known) {
	    forget_single_object(Dragon_scales_to_mail(obj_id));
	} else if (Is_dragon_mail(obj_id) &&
		   objects[Dragon_mail_to_scales(obj_id)].oc_name_known) {
	    forget_single_object(Dragon_mail_to_scales(obj_id));
	}
	/* clear & free object names from matching inventory items too? */
}